

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_DataBlob_impl.hpp
# Opt level: O0

void __thiscall hrgls::datablob::DataBlob::DataBlob(DataBlob *this,hrgls_DataBlob blob)

{
  hrgls_Status hVar1;
  DataBlob_private *this_00;
  hrgls_DataBlob blob_local;
  DataBlob *this_local;
  
  this->m_private = (DataBlob_private *)0x0;
  this_00 = (DataBlob_private *)operator_new(0x10);
  DataBlob_private::DataBlob_private(this_00);
  this->m_private = this_00;
  if (blob == (hrgls_DataBlob)0x0) {
    this->m_private->status = 0x3e9;
  }
  else {
    hVar1 = hrgls_DataBlobCopy(&this->m_private->blob,blob);
    this->m_private->status = hVar1;
  }
  return;
}

Assistant:

DataBlob::DataBlob(hrgls_DataBlob blob)
    {
      m_private = new DataBlob_private;
      if (!blob) {
        m_private->status = hrgls_STATUS_BAD_PARAMETER;
        return;
      }
      m_private->status = hrgls_DataBlobCopy(&m_private->blob, blob);
    }